

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_type(lysp_yang_ctx *ctx,lysp_type *type)

{
  uint8_t *puVar1;
  lysp_type *plVar2;
  long lVar3;
  lysp_type *plVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  undefined8 *puVar7;
  lysp_restr *plVar8;
  ushort uVar9;
  char *format;
  size_t *word_len_00;
  LY_ERR ret__;
  ly_ctx *plVar10;
  char *pcVar11;
  lysp_ext_instance **exts;
  bool bVar12;
  bool bVar13;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *str_path;
  char *buf;
  undefined2 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff62;
  undefined4 in_stack_ffffffffffffff64;
  ly_stmt local_84;
  char *local_80;
  size_t local_78;
  char *local_70;
  lysp_ext_instance **local_68;
  lyxp_expr **local_60;
  char ***local_58;
  lysp_type_enum **local_50;
  lysp_type_enum **local_48;
  lysp_restr **local_40;
  lysp_ext_instance *local_38;
  
  local_70 = (char *)0x0;
  if (type->name != (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar10 = (ly_ctx *)0x0;
    }
    else {
      plVar10 = (ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Duplicate keyword \"%s\".";
    pcVar11 = "type";
LAB_00176931:
    ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar11);
    return LY_EVALID;
  }
  exts = &local_38;
  LVar5 = get_argument(ctx,Y_PREF_IDENTIF_ARG,(uint16_t *)0x0,&local_80,(char **)exts,&local_78);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  if (local_38 == (lysp_ext_instance *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar10 = (ly_ctx *)0x0;
    }
    else {
      plVar10 = (ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar11 = local_80;
    if (local_78 == 0) {
      pcVar11 = "";
    }
    LVar5 = lydict_insert(plVar10,pcVar11,local_78,&type->name);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar10 = (ly_ctx *)0x0;
    }
    else {
      plVar10 = (ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar5 = lydict_insert_zc(plVar10,local_80,&type->name);
  }
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  type->pmod = (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  word_len_00 = &local_78;
  LVar5 = get_keyword(ctx,&local_84,&local_80,word_len_00);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  if (local_84 == LY_STMT_SYNTAX_SEMICOLON) {
    bVar12 = true;
  }
  else {
    if (local_84 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar10 = (ly_ctx *)0x0;
      }
      else {
        plVar10 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar11 = lyplg_ext_stmt2str(local_84);
      format = "Invalid keyword \"%s\", expected \";\" or \"{\".";
      goto LAB_00176931;
    }
    word_len_00 = &local_78;
    LVar5 = get_keyword(ctx,&local_84,&local_80,word_len_00);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    bVar12 = local_84 == LY_STMT_SYNTAX_RIGHT_BRACE;
  }
  if (bVar12) {
    return LY_SUCCESS;
  }
  local_68 = &type->exts;
  local_40 = &type->patterns;
  local_60 = &type->path;
  local_48 = &type->enums;
  local_50 = &type->bits;
  local_58 = &type->bases;
  LVar5 = LY_SUCCESS;
  do {
    if ((int)local_84 < 0x170000) {
      if ((int)local_84 < 0xb0000) {
        if (local_84 == LY_STMT_BASE) {
          LVar6 = parse_text_fields(ctx,(ly_stmt)local_58,(char ***)local_68,(yang_arg)word_len_00,
                                    exts);
          uVar9 = 1;
        }
        else {
          if (local_84 != LY_STMT_BIT) {
LAB_00176f2d:
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar10 = (ly_ctx *)0x0;
            }
            else {
              plVar10 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar11 = lyplg_ext_stmt2str(local_84);
            ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar11,"type");
            return LY_EVALID;
          }
          LVar6 = parse_type_enum(ctx,LY_STMT_BIT,local_50);
          uVar9 = 2;
        }
      }
      else if (local_84 == LY_STMT_ENUM) {
        LVar6 = parse_type_enum(ctx,LY_STMT_ENUM,local_48);
        uVar9 = 4;
      }
      else {
        if (local_84 == LY_STMT_EXTENSION_INSTANCE) {
          exts = (lysp_ext_instance **)0x2e0000;
          LVar6 = parse_ext(ctx,local_80,local_78,type,LY_STMT_TYPE,0,local_68);
          goto LAB_00176c68;
        }
        if (local_84 != LY_STMT_FRACTION_DIGITS) goto LAB_00176f2d;
        LVar6 = parse_type_fracdigits(ctx,type);
        uVar9 = 8;
      }
      goto LAB_00176e35;
    }
    if ((int)local_84 < 0x260000) {
      if (local_84 == LY_STMT_LENGTH) {
        if (type->length != (lysp_restr *)0x0) {
LAB_00176ee6:
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
LAB_00176ffd:
          pcVar11 = lyplg_ext_stmt2str(local_84);
          format = "Duplicate keyword \"%s\".";
          goto LAB_00176931;
        }
        plVar8 = (lysp_restr *)calloc(1,0x40);
        type->length = plVar8;
        if (plVar8 == (lysp_restr *)0x0) {
LAB_00176f0b:
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type");
          return LY_EMEM;
        }
        LVar6 = parse_restr(ctx,LY_STMT_LENGTH,plVar8);
        uVar9 = 0x10;
LAB_00176e35:
        bVar13 = LVar6 == LY_SUCCESS;
        if (!bVar13) {
          LVar5 = LVar6;
        }
      }
      else {
        if (local_84 != LY_STMT_PATH) {
          if (local_84 != LY_STMT_PATTERN) goto LAB_00176f2d;
          LVar6 = parse_type_pattern(ctx,local_40);
          uVar9 = 0x40;
          goto LAB_00176e35;
        }
        if (*local_60 != (lyxp_expr *)0x0) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          local_84 = LY_STMT_PATH;
          goto LAB_00176ffd;
        }
        LVar6 = parse_text_field(ctx,type,LY_STMT_PATH,(uint32_t)&local_70,(char **)0x2,
                                 Y_IDENTIF_ARG,(uint16_t *)local_68,
                                 (lysp_ext_instance **)
                                 CONCAT44(in_stack_ffffffffffffff64,
                                          CONCAT22(in_stack_ffffffffffffff62,
                                                   in_stack_ffffffffffffff60)));
        if (LVar6 != LY_SUCCESS) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          lydict_remove(plVar10,local_70);
          return LVar6;
        }
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar10 = (ly_ctx *)0x0;
        }
        else {
          plVar10 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
          ;
        }
        in_stack_ffffffffffffff60 = 0x400;
        in_stack_ffffffffffffff62 = 0;
        exts = (lysp_ext_instance **)0x1;
        LVar6 = ly_path_parse(plVar10,(lysc_node *)0x0,local_70,0,'\x01',2,0x10,0x400,local_60);
        plVar10 = (ly_ctx *)0x0;
        if (ctx != (lysp_yang_ctx *)0x0) {
          plVar10 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
          ;
        }
        lydict_remove(plVar10,local_70);
        uVar9 = 0x20;
        bVar13 = LVar6 == LY_SUCCESS;
        if (!bVar13) {
          LVar5 = LVar6;
        }
      }
      if (!bVar13) {
        return LVar5;
      }
      type->flags = type->flags | uVar9;
    }
    else {
      if (local_84 == LY_STMT_RANGE) {
        if (type->range != (lysp_restr *)0x0) goto LAB_00176ee6;
        plVar8 = (lysp_restr *)calloc(1,0x40);
        type->range = plVar8;
        if (plVar8 == (lysp_restr *)0x0) goto LAB_00176f0b;
        LVar6 = parse_restr(ctx,LY_STMT_RANGE,plVar8);
        uVar9 = 0x80;
        goto LAB_00176e35;
      }
      if (local_84 != LY_STMT_REQUIRE_INSTANCE) {
        if (local_84 != LY_STMT_TYPE) goto LAB_00176f2d;
        plVar2 = type->types;
        if (plVar2 == (lysp_type *)0x0) {
          puVar7 = (undefined8 *)malloc(0x70);
          if (puVar7 != (undefined8 *)0x0) {
            *puVar7 = 1;
            goto LAB_00176d27;
          }
LAB_00176d37:
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar10 = (ly_ctx *)0x0;
          }
          else {
            plVar10 = (ly_ctx *)
                      **(undefined8 **)
                        (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          bVar13 = false;
          LVar5 = LY_EMEM;
          exts = (lysp_ext_instance **)0x1dbe3f;
          ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
        }
        else {
          lVar3 = *(long *)&plVar2[-1].fraction_digits;
          *(long *)&plVar2[-1].fraction_digits = lVar3 + 1;
          puVar7 = (undefined8 *)realloc(&plVar2[-1].fraction_digits,lVar3 * 0x68 + 0x70);
          if (puVar7 == (undefined8 *)0x0) {
            puVar1 = &type->types[-1].fraction_digits;
            *(long *)puVar1 = *(long *)puVar1 + -1;
            goto LAB_00176d37;
          }
LAB_00176d27:
          type->types = (lysp_type *)(puVar7 + 1);
          bVar13 = true;
        }
        if (!bVar13) {
          return LVar5;
        }
        plVar2 = type->types;
        lVar3 = *(long *)&plVar2[-1].fraction_digits;
        plVar2[lVar3 + -1].pmod = (lysp_module *)0x0;
        plVar2[lVar3 + -1].compiled = (lysc_type *)0x0;
        plVar2[lVar3 + -1].types = (lysp_type *)0x0;
        plVar2[lVar3 + -1].exts = (lysp_ext_instance *)0x0;
        plVar2[lVar3 + -1].path = (lyxp_expr *)0x0;
        plVar2[lVar3 + -1].bases = (char **)0x0;
        plVar2[lVar3 + -1].enums = (lysp_type_enum *)0x0;
        plVar2[lVar3 + -1].bits = (lysp_type_enum *)0x0;
        plVar2[lVar3 + -1].length = (lysp_restr *)0x0;
        plVar2[lVar3 + -1].patterns = (lysp_restr *)0x0;
        plVar2[lVar3 + -1].name = (char *)0x0;
        plVar2[lVar3 + -1].range = (lysp_restr *)0x0;
        plVar4 = plVar2 + lVar3 + -1;
        plVar4->fraction_digits = '\0';
        plVar4->require_instance = '\0';
        plVar4->flags = 0;
        *(undefined4 *)&plVar4->field_0x64 = 0;
        LVar6 = parse_type(ctx,plVar2 + lVar3 + -1);
        uVar9 = 0x100;
        goto LAB_00176e35;
      }
      LVar6 = parse_type_reqinstance(ctx,type);
LAB_00176c68:
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
    }
    word_len_00 = &local_78;
    LVar6 = get_keyword(ctx,&local_84,&local_80,&local_78);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    if (local_84 == LY_STMT_SYNTAX_RIGHT_BRACE) {
      bVar12 = true;
      if (type->exts != (lysp_ext_instance *)0x0) {
        word_len_00 = (size_t *)0x0;
        LVar6 = ly_set_add(&ctx->main_ctx->ext_inst,type->exts,'\x01',(uint32_t *)0x0);
        if (LVar6 != LY_SUCCESS) {
          return LVar6;
        }
      }
    }
    if (bVar12) {
      return LY_SUCCESS;
    }
  } while( true );
}

Assistant:

static LY_ERR
parse_type(struct lysp_yang_ctx *ctx, struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    const char *str_path = NULL;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_type *nest_type;

    if (type->name) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "type");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_PREF_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, type->name, word, word_len, ret, cleanup);

    /* set module */
    type->pmod = PARSER_CUR_PMOD(ctx);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_BASE:
            LY_CHECK_RET(parse_text_fields(ctx, LY_STMT_BASE, &type->bases, Y_PREF_IDENTIF_ARG, &type->exts));
            type->flags |= LYS_SET_BASE;
            break;
        case LY_STMT_BIT:
            LY_CHECK_RET(parse_type_enum(ctx, kw, &type->bits));
            type->flags |= LYS_SET_BIT;
            break;
        case LY_STMT_ENUM:
            LY_CHECK_RET(parse_type_enum(ctx, kw, &type->enums));
            type->flags |= LYS_SET_ENUM;
            break;
        case LY_STMT_FRACTION_DIGITS:
            LY_CHECK_RET(parse_type_fracdigits(ctx, type));
            type->flags |= LYS_SET_FRDIGITS;
            break;
        case LY_STMT_LENGTH:
            if (type->length) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(kw));
                return LY_EVALID;
            }
            type->length = calloc(1, sizeof *type->length);
            LY_CHECK_ERR_RET(!type->length, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(parse_restr(ctx, kw, type->length));
            type->flags |= LYS_SET_LENGTH;
            break;
        case LY_STMT_PATH:
            if (type->path) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(LY_STMT_PATH));
                return LY_EVALID;
            }

            /* Usually, in the parser_yang.c, the result of the parsing is stored directly in the
             * corresponding structure, so in case of failure, the lysp_module_free function will take
             * care of removing the parsed value from the dictionary. But in this case, it is not possible
             * to rely on lysp_module_free because the result of the parsing is stored in a local variable.
             */
            LY_CHECK_ERR_RET(ret = parse_text_field(ctx, type, LY_STMT_PATH, 0, &str_path, Y_STR_ARG, NULL, &type->exts),
                    lydict_remove(PARSER_CTX(ctx), str_path), ret);
            ret = ly_path_parse(PARSER_CTX(ctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                    LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, &type->path);
            /* Moreover, even if successful, the string is removed from the dictionary. */
            lydict_remove(PARSER_CTX(ctx), str_path);
            LY_CHECK_RET(ret);
            type->flags |= LYS_SET_PATH;
            break;
        case LY_STMT_PATTERN:
            LY_CHECK_RET(parse_type_pattern(ctx, &type->patterns));
            type->flags |= LYS_SET_PATTERN;
            break;
        case LY_STMT_RANGE:
            if (type->range) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(kw));
                return LY_EVALID;
            }
            type->range = calloc(1, sizeof *type->range);
            LY_CHECK_ERR_RET(!type->range, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(parse_restr(ctx, kw, type->range));
            type->flags |= LYS_SET_RANGE;
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            LY_CHECK_RET(parse_type_reqinstance(ctx, type));
            /* LYS_SET_REQINST checked and set inside parse_type_reqinstance() */
            break;
        case LY_STMT_TYPE:
            LY_ARRAY_NEW_RET(PARSER_CTX(ctx), type->types, nest_type, LY_EMEM);
            LY_CHECK_RET(parse_type(ctx, nest_type));
            type->flags |= LYS_SET_TYPE;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, type, LY_STMT_TYPE, 0, &type->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "type");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, type->exts, ret, cleanup);
    }

cleanup:
    return ret;
}